

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_to_uint64_array(void **param_1)

{
  initializer_list<unsigned_long> __l;
  bool bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> a2;
  uint64_t val;
  iterator __end1;
  iterator __begin1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> a1;
  roaring64_bitmap_t *r;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff18;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffff20;
  uint64_t in_stack_ffffffffffffff28;
  allocator_type *__a;
  roaring64_bitmap_t *r_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  allocator_type *in_stack_ffffffffffffff48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff50;
  iterator in_stack_ffffffffffffff58;
  size_type in_stack_ffffffffffffff60;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  undefined1 *local_88;
  undefined1 local_69 [25];
  roaring64_bitmap_t *r_01;
  uint64_t *out;
  roaring64_bitmap_t *r_02;
  roaring64_bitmap_t *local_10;
  
  local_10 = roaring64_bitmap_create();
  local_69._17_8_ = 0x800000001;
  r_01 = (roaring64_bitmap_t *)0x800000002;
  local_69._1_8_ = 0;
  local_69._9_8_ = 0x800000000;
  out = (uint64_t *)(local_69 + 1);
  r_02 = (roaring64_bitmap_t *)0x5;
  r_00 = (roaring64_bitmap_t *)local_69;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x107f87);
  __l._M_len = in_stack_ffffffffffffff60;
  __l._M_array = in_stack_ffffffffffffff58;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffff50,__l,in_stack_ffffffffffffff48);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x107fb5);
  local_88 = &stack0xffffffffffffffd8;
  local_90._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(in_stack_ffffffffffffff18);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff20,
                       (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                        *)in_stack_ffffffffffffff18);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator*(&local_90);
    roaring64_bitmap_add(r_00,in_stack_ffffffffffffff28);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++(&local_90);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffd8);
  this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  __a = (allocator_type *)&stack0xffffffffffffff3f;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x108083);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this,(size_type)in_stack_ffffffffffffff38,(value_type *)r_00,__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x1080a8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1080be);
  roaring64_bitmap_to_uint64_array(r_02,out);
  assert_vector_equal(this,in_stack_ffffffffffffff38);
  roaring64_bitmap_free(r_01);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)r_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)r_00);
  return;
}

Assistant:

DEFINE_TEST(test_to_uint64_array) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    std::vector<uint64_t> a1 = {0, 1ULL << 35, (1Ull << 35) + 1,
                                (1Ull << 35) + 2, 1Ull << 36};
    for (uint64_t val : a1) {
        roaring64_bitmap_add(r, val);
    }

    std::vector<uint64_t> a2(a1.size(), 0);
    roaring64_bitmap_to_uint64_array(r, a2.data());
    assert_vector_equal(a2, a1);

    roaring64_bitmap_free(r);
}